

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

Gia_Man_t * Gia_ManStuckAtUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  char *__assertion;
  Gia_Obj_t *pObj;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart(p->nObjs * 3);
  pcVar12 = p->pName;
  if (pcVar12 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar12);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar12);
  }
  p_00->pName = pcVar7;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar14];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00594a49;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
      pGVar2[iVar5].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  if (p->nObjs < 1) {
    uVar11 = 0;
  }
  else {
    lVar14 = 0;
    lVar15 = 8;
    uVar11 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)((long)pGVar2 + lVar15 + -8);
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        uVar13 = *(uint *)((long)pGVar2 +
                          lVar15 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
        if (((int)uVar13 < 0) ||
           (uVar1 = *(uint *)((long)pGVar2 +
                             lVar15 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_00594a68;
        iVar5 = Gia_ManHashAnd(p_00,uVar13 ^ (uint)(uVar3 >> 0x1d) & 1,
                               uVar1 ^ (uint)(uVar3 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar15) = iVar5;
        if (((int)uVar11 < 0) || (vMap->nSize <= (int)uVar11)) {
LAB_00594a87:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = vMap->pArray[uVar11];
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar3 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar3 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if (iVar5 == 0) {
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
          if ((pGVar8 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
        }
        else {
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
          uVar13 = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
          if ((int)uVar13 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          iVar5 = Gia_ManHashAnd(p_00,uVar13 | 1,*(int *)(&pGVar2->field_0x0 + lVar15));
          *(int *)(&pGVar2->field_0x0 + lVar15) = iVar5;
        }
        uVar13 = uVar11 + 1;
        if (vMap->nSize <= (int)uVar13) goto LAB_00594a87;
        uVar11 = uVar11 + 2;
        iVar5 = vMap->pArray[uVar13];
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar3 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar3 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if (iVar5 == 0) {
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
          if ((pGVar8 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
        }
        else {
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_00594a2a;
          iVar5 = Gia_ManHashOr(p_00,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556,
                                *(int *)(&pGVar2->field_0x0 + lVar15));
          *(int *)(&pGVar2->field_0x0 + lVar15) = iVar5;
        }
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  if (uVar11 == vMap->nSize) {
    pVVar9 = p->vCos;
    if (0 < pVVar9->nSize) {
      lVar14 = 0;
      do {
        iVar5 = pVVar9->pArray[lVar14];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00594a49:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + iVar5;
        if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_00594a68:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                      pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].
                                      Value);
        pGVar2->Value = uVar11;
        lVar14 = lVar14 + 1;
        pVVar9 = p->vCos;
      } while (lVar14 < pVVar9->nSize);
    }
    pGVar10 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    iVar5 = p->vCis->nSize;
    if (pGVar10->vCis->nSize - pGVar10->nRegs != iVar5 + (~(p->vCos->nSize + iVar5) + p->nObjs) * 2)
    {
      __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 2 * Gia_ManAndNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                    ,0x1de,"Gia_Man_t *Gia_ManStuckAtUnfold(Gia_Man_t *, Vec_Int_t *)");
    }
    return pGVar10;
  }
  __assertion = "iFuncVars == Vec_IntSize(vMap)";
  pcVar7 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c";
  pcVar12 = "Gia_Man_t *Gia_ManStuckAtUnfold(Gia_Man_t *, Vec_Int_t *)";
LAB_00594a3f:
  __assert_fail(__assertion,pcVar7,0x1d9,pcVar12);
LAB_00594a2a:
  __assertion = "p->pObjs <= pObj && pObj < p->pObjs + p->nObjs";
  pcVar7 = "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h";
  pcVar12 = "int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)";
  goto LAB_00594a3f;
}

Assistant:

Gia_Man_t * Gia_ManStuckAtUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iFuncVars = 0;
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashAnd( pNew, Abc_LitNot(Gia_ManAppendCi(pNew)), pObj->Value );
        else
            Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashOr( pNew, Gia_ManAppendCi(pNew), pObj->Value );
        else
            Gia_ManAppendCi(pNew);
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 2 * Gia_ManAndNum(p) );
    return pNew;
}